

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
* docopt::docopt_parse
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
             *__return_storage_ptr__,string *doc,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *argv,bool help,bool version,bool options_first)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  pointer this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iter;
  pointer psVar4;
  undefined8 uVar5;
  int iVar6;
  Pattern *pPVar7;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  undefined4 extraout_var_00;
  runtime_error *prVar9;
  undefined3 in_register_00000081;
  undefined4 uVar10;
  undefined4 in_register_00000084;
  shared_ptr<docopt::LeafPattern> *p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  pointer psVar12;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  collected;
  string leftover;
  BranchPattern local_158;
  undefined1 local_138 [32];
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_118;
  Variant local_f8;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [32];
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_78;
  Tokens local_58;
  
  uVar10 = CONCAT31(in_register_00000081,version);
  local_158.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b9648;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_98);
  local_158.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b9438;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  create_pattern_tree((pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                       *)local_98,doc);
  local_138._16_8_ =
       local_158.fChildren.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138._8_8_ =
       local_158.fChildren.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_138._0_8_ =
       local_158.fChildren.
       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._8_8_;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._16_8_;
  local_158.fChildren.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._24_8_;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  local_98._24_8_ = (pointer)0x0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_138);
  local_138._16_8_ =
       local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_138._8_8_ =
       local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138._0_8_ =
       local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_118.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector
            ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)local_138);
  std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_78);
  local_98._0_8_ = &PTR_flat_001b9648;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)(local_98 + 8));
  local_f8.strList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.longValue = 0;
  local_f8.strValue._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8,argv);
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.fTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.fIndex = 0;
  local_58.fIsParsingArgv = true;
  parse_argv((PatternList *)local_138,&local_58,&local_118,options_first);
  local_98._16_8_ =
       local_f8.strList.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98._8_8_ = local_f8.strValue._M_string_length;
  local_98._0_8_ = local_f8.longValue;
  local_f8.longValue = local_138._0_8_;
  local_f8.strValue._M_string_length = local_138._8_8_;
  local_f8.strList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._16_8_;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = (pointer)0x0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_98);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.fTokens);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  extras(help,version,(PatternList *)&local_f8.strValue);
  local_d8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar7 = BranchPattern::fix(&local_158);
  iVar6 = (*pPVar7->_vptr_Pattern[2])(pPVar7,&local_f8,&local_d8);
  if ((char)iVar6 != '\0') {
    if (local_f8.longValue == local_f8.strValue._M_string_length) {
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      Pattern::leaves((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
                      local_98,&local_158.super_Pattern);
      uVar5 = local_98._8_8_;
      for (p_Var11 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
          p_Var11 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)uVar5; p_Var11 = p_Var11 + 1) {
        peVar2 = ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_pi)->
                 _M_ptr;
        iVar6 = (*peVar2->_vptr_Pattern[3])(peVar2);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)CONCAT44(extraout_var,iVar6));
        value::operator=(pmVar8,(value *)(peVar2 + 5));
      }
      psVar12 = local_d8.
                super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = local_d8.
               super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)local_98._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_98._0_8_);
        psVar12 = local_d8.
                  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_d8.
                 super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar12 != psVar4; psVar12 = psVar12 + 1) {
        peVar3 = (psVar12->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar6 = (*(peVar3->super_Pattern)._vptr_Pattern[3])(peVar3);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)CONCAT44(extraout_var_00,iVar6));
        value::operator=(pmVar8,&peVar3->fValue);
      }
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)&local_f8.strValue);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_118);
      local_158.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b9648;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_158.fChildren);
      return __return_storage_ptr__;
    }
    if ((char)iVar6 != '\0') {
      this = (argv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      iter._M_current =
           (argv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_138._0_8_ = (pointer)(local_138 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,", ","");
      (anonymous_namespace)::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((string *)local_98,(_anonymous_namespace_ *)this,iter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 (string *)CONCAT44(in_register_00000084,uVar10));
      if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "Unexpected argument: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::runtime_error::runtime_error(prVar9,(string *)local_138);
      *(undefined ***)prVar9 = &PTR__runtime_error_001b9698;
      __cxa_throw(prVar9,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Arguments did not match expected patterns");
  *(undefined ***)prVar9 = &PTR__runtime_error_001b9698;
  __cxa_throw(prVar9,&DocoptArgumentError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::map<std::string, value>
docopt::docopt_parse(std::string const& doc,
		     std::vector<std::string> const& argv,
		     bool help,
		     bool version,
		     bool options_first)
{
	//std::cout << "doc: " << doc << std::endl;
	//std::cout << "argv: " << argv << std::endl;
	
	Required pattern;
	std::vector<Option> options;
	try {
		std::tie(pattern, options) = create_pattern_tree(doc);
	} catch (Tokens::OptionError const& error) {
		throw DocoptLanguageError(error.what());
	}
	
	PatternList argv_patterns;
	try {
		argv_patterns = parse_argv(Tokens(argv), options, options_first);
	} catch (Tokens::OptionError const& error) {
		throw DocoptArgumentError(error.what());
	}
	
	extras(help, version, argv_patterns);
	
	std::vector<std::shared_ptr<LeafPattern>> collected;
	bool matched = pattern.fix().match(argv_patterns, collected);
	if (matched && argv_patterns.empty()) {
		std::map<std::string, value> ret;
		
		// (a.name, a.value) for a in (pattern.flat() + collected)
		for (auto* p : pattern.leaves()) {
			ret[p->name()] = p->getValue();
		}
		
		for (auto const& p : collected) {
			ret[p->name()] = p->getValue();
		}
		
		return ret;
	}
	
	if (matched) {
		std::string leftover = join(argv.begin(), argv.end(), ", ");
		throw DocoptArgumentError("Unexpected argument: " + leftover);
	}
	
	throw DocoptArgumentError("Arguments did not match expected patterns"); // BLEH. Bad error.
}